

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

uint __thiscall Kernel::Clause::maxVar(Clause *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  VirtualIterator<unsigned_int> it;
  VirtualIterator<unsigned_int> local_10;
  
  getVariableIterator((Clause *)&stack0xfffffffffffffff0);
  uVar3 = 0;
  while (iVar1 = (*(local_10._core)->_vptr_IteratorCore[2])(), (char)iVar1 != '\0') {
    uVar2 = (*(local_10._core)->_vptr_IteratorCore[3])();
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
  }
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator(&stack0xfffffffffffffff0);
  return uVar3;
}

Assistant:

unsigned Clause::maxVar()
{
  unsigned max = 0;
  VirtualIterator<unsigned> it = getVariableIterator();

  while (it.hasNext()) {
    unsigned n = it.next();
    max = n > max ? n : max;
  }
  return max;
}